

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

string * __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory::getDescription_abi_cxx11_
          (TypedListenerFactory *this)

{
  undefined8 in_RSI;
  string *in_RDI;
  
  getDescriptionImpl_abi_cxx11_((TypedListenerFactory *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string getDescription() const override {
                return getDescriptionImpl( Detail::has_description<T>{} );
            }